

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O0

void * override_EGL_eglGetProcAddress(char *name)

{
  int iVar1;
  void *handle;
  code *pcVar2;
  _func_void_ptr_char_ptr *real_func;
  void *lib;
  void *symbol;
  char *name_local;
  
  iVar1 = strncmp(name,"gl",2);
  if (((iVar1 != 0) || (name_local = (char *)wrapped_dlsym("GLES2",name), name_local == (char *)0x0)
      ) && ((iVar1 = strncmp(name,"egl",3), iVar1 != 0 ||
            (name_local = (char *)wrapped_dlsym("EGL",name), name_local == (char *)0x0)))) {
    handle = dlwrap_real_dlopen("libEGL.so.1",1);
    pcVar2 = (code *)dlwrap_real_dlsym(handle,"eglGetProcAddress");
    name_local = (char *)(*pcVar2)(name);
  }
  return name_local;
}

Assistant:

void *
override_EGL_eglGetProcAddress(const char *name)
{
    void *symbol;

    if (!STRNCMP_LITERAL(name, "gl")) {
        symbol = wrapped_dlsym("GLES2", name);
        if (symbol)
            return symbol;
    }

    if (!STRNCMP_LITERAL(name, "egl")) {
        symbol = wrapped_dlsym("EGL", name);
        if (symbol)
            return symbol;
    }

    return DEFER_TO_GL("libEGL.so.1", override_EGL_eglGetProcAddress,
                       "eglGetProcAddress", (name));
}